

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O3

void __thiscall dap::json::JsonCppSerializer::JsonCppSerializer(JsonCppSerializer *this)

{
  Value *this_00;
  
  (this->super_Serializer)._vptr_Serializer = (_func_int **)&PTR__JsonCppSerializer_00b3e740;
  this_00 = (Value *)operator_new(0x28);
  Json::Value::Value(this_00,nullValue);
  this->json = this_00;
  this->ownsJson = true;
  this->removed = false;
  return;
}

Assistant:

JsonCppSerializer::JsonCppSerializer()
    : json(new Json::Value()), ownsJson(true) {}